

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_number.hpp
# Opt level: O0

bool jsoncons::detail::dtoa_general<jsoncons::string_sink<std::__cxx11::string>>
               (string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *param_1,char param_2,undefined8 param_3)

{
  bool bVar1;
  double u;
  char buffer [100];
  int *in_stack_00000088;
  int k;
  int length;
  char *result;
  double in_stack_000000a0;
  value_type in_stack_ffffffffffffff4f;
  string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff50;
  string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  size_t in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  undefined1 local_1;
  
  if (((double)param_1 != 0.0) || (NAN((double)param_1))) {
    bVar1 = std::signbit((double)param_1);
    this = param_1;
    if (bVar1) {
      this = (string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((ulong)param_1 ^ 0x8000000000000000);
    }
    bVar1 = grisu3(in_stack_000000a0,result,_k,in_stack_00000088);
    if (bVar1) {
      bVar1 = std::signbit((double)param_1);
      if (bVar1) {
        string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::push_back(this,in_stack_ffffffffffffff4f);
      }
      prettify_string<jsoncons::string_sink<std::__cxx11::string>>
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                 in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff70);
      local_1 = true;
    }
    else {
      local_1 = dtoa_general<jsoncons::string_sink<std::__cxx11::string>>
                          (param_1,(int)param_2,param_3);
    }
  }
  else {
    string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    push_back(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4f);
    string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    push_back(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4f);
    string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    push_back(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4f);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool dtoa_general(double v, char decimal_point, Result& result, std::true_type)
    {
        if (v == 0)
        {
            result.push_back('0');
            result.push_back('.');
            result.push_back('0');
            return true;
        }

        int length = 0;
        int k;

        char buffer[100];

        double u = std::signbit(v) ? -v : v;
        if (jsoncons::detail::grisu3(u, buffer, &length, &k))
        {
            if (std::signbit(v))
            {
                result.push_back('-');
            }
            // min exp: -4 is consistent with sprintf
            // max exp: std::numeric_limits<double>::max_digits10
            jsoncons::detail::prettify_string(buffer, length, k, -4, std::numeric_limits<double>::max_digits10, result);
            return true;
        }
        else
        {
            return dtoa_general(v, decimal_point, result, std::false_type());
        }
    }